

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void Json::StreamWriterBuilder::setDefaults(Value *settings)

{
  Value *pVVar1;
  Value *key;
  Value *this;
  Value *in_stack_ffffffffffffff28;
  undefined1 value;
  Value *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  Value *in_stack_ffffffffffffff40;
  Value *in_stack_ffffffffffffff60;
  
  Value::Value(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  pVVar1 = Value::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  Value::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  Value::~Value(in_stack_ffffffffffffff60);
  Value::Value(pVVar1,in_stack_ffffffffffffff38);
  key = Value::operator[](pVVar1,in_stack_ffffffffffffff38);
  Value::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  Value::~Value(in_stack_ffffffffffffff60);
  Value::Value(in_stack_ffffffffffffff30,SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0));
  this = Value::operator[](pVVar1,(char *)key);
  Value::operator=(this,in_stack_ffffffffffffff28);
  value = (undefined1)((ulong)in_stack_ffffffffffffff28 >> 0x38);
  Value::~Value(in_stack_ffffffffffffff60);
  Value::Value(this,(bool)value);
  pVVar1 = Value::operator[](pVVar1,(char *)key);
  Value::operator=(this,pVVar1);
  Value::~Value(in_stack_ffffffffffffff60);
  return;
}

Assistant:

void StreamWriterBuilder::setDefaults(Json::Value* settings)
{
  //! [StreamWriterBuilderDefaults]
  (*settings)["commentStyle"] = "All";
  (*settings)["indentation"] = "\t";
  (*settings)["enableYAMLCompatibility"] = false;
  (*settings)["dropNullPlaceholders"] = false;
  //! [StreamWriterBuilderDefaults]
}